

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

void __thiscall
Centaurus::CharClass<unsigned_char>::CharClass
          (CharClass<unsigned_char> *this,initializer_list<wchar_t> *ch_list)

{
  size_type sVar1;
  iterator pwVar2;
  long lVar3;
  Range<unsigned_char> local_40;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_001bd4b8;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = ch_list->_M_len;
  if (sVar1 != 0) {
    pwVar2 = ch_list->_M_array;
    lVar3 = 0;
    do {
      local_40.m_start = *(uchar *)((long)pwVar2 + lVar3);
      local_40._vptr_Range = (_func_int **)&PTR__Range_001bd558;
      local_40.m_end = local_40.m_start + '\x01';
      std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
      emplace_back<Centaurus::Range<unsigned_char>>
                ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                  *)&this->m_ranges,&local_40);
      lVar3 = lVar3 + 4;
    } while (sVar1 << 2 != lVar3);
  }
  return;
}

Assistant:

CharClass(const std::initializer_list<wchar_t>& ch_list)
    {
        for (wchar_t ch : ch_list)
        {
            m_ranges.push_back(Range<TCHAR>(ch, ch + 1));
        }
    }